

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_mull(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 ret;
  uint16_t uVar1;
  TCGv_i32 pTVar2;
  ulong uVar3;
  uint uVar4;
  TCGv_i32 *ppTVar5;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = read_im16(env,s);
  if ((uVar1 >> 10 & 1) == 0) {
    pTVar2 = gen_ea(env,s,insn,2,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                    (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar2 == tcg_ctx->NULL_QREG) {
LAB_00677acc:
      gen_addr_fault(s);
      return;
    }
    if ((s->env->features & 1) == 0) {
      uVar3 = (ulong)(uVar1 >> 9 & 0x38);
      ret = *(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + uVar3);
      tcg_gen_mul_i32(tcg_ctx,ret,pTVar2,ret);
      gen_logic_cc(s,*(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + uVar3),2);
      return;
    }
    tcg_gen_movi_i32(tcg_ctx,QREG_CC_C,0);
    uVar4 = uVar1 >> 0xc & 7;
    if ((uVar1 >> 0xb & 1) == 0) {
      tcg_gen_mulu2_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_V,pTVar2,tcg_ctx->cpu_dregs[uVar4]);
      ppTVar5 = &QREG_CC_C;
    }
    else {
      tcg_gen_muls2_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_V,pTVar2,tcg_ctx->cpu_dregs[uVar4]);
      ppTVar5 = &QREG_CC_Z;
      tcg_gen_sari_i32_m68k(tcg_ctx,QREG_CC_Z,QREG_CC_N,0x1f);
    }
    tcg_gen_setcond_i32_m68k(tcg_ctx,TCG_COND_NE,QREG_CC_V,QREG_CC_V,*ppTVar5);
    tcg_gen_neg_i32(tcg_ctx,QREG_CC_V,QREG_CC_V);
    tcg_gen_mov_i32(tcg_ctx,tcg_ctx->cpu_dregs[uVar4],QREG_CC_N);
    tcg_gen_mov_i32(tcg_ctx,QREG_CC_Z,QREG_CC_N);
  }
  else {
    if ((s->env->features & 0x40000) == 0) {
      gen_exception(s,(s->base).pc_next,4);
      return;
    }
    pTVar2 = gen_ea(env,s,insn,2,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                    (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar2 == tcg_ctx->NULL_QREG) goto LAB_00677acc;
    uVar4 = uVar1 >> 0xc & 7;
    if ((uVar1 >> 0xb & 1) == 0) {
      tcg_gen_mulu2_i32_m68k(tcg_ctx,QREG_CC_Z,QREG_CC_N,pTVar2,tcg_ctx->cpu_dregs[uVar4]);
    }
    else {
      tcg_gen_muls2_i32_m68k(tcg_ctx,QREG_CC_Z,QREG_CC_N,pTVar2,tcg_ctx->cpu_dregs[uVar4]);
    }
    tcg_gen_mov_i32(tcg_ctx,tcg_ctx->cpu_dregs[uVar1 & 7],QREG_CC_N);
    tcg_gen_mov_i32(tcg_ctx,tcg_ctx->cpu_dregs[uVar4],QREG_CC_Z);
    tcg_gen_or_i32(tcg_ctx,QREG_CC_Z,QREG_CC_Z,QREG_CC_N);
    tcg_gen_movi_i32(tcg_ctx,QREG_CC_V,0);
    tcg_gen_movi_i32(tcg_ctx,QREG_CC_C,0);
  }
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

DISAS_INSN(mull)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint16_t ext;
    TCGv src1;
    int sign;

    ext = read_im16(env, s);

    sign = ext & 0x800;

    if (ext & 0x400) {
        if (!m68k_feature(s->env, M68K_FEATURE_QUAD_MULDIV)) {
            gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
            return;
        }

        SRC_EA(env, src1, OS_LONG, 0, NULL);

        if (sign) {
            tcg_gen_muls2_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N, src1, DREG(ext, 12));
        } else {
            tcg_gen_mulu2_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N, src1, DREG(ext, 12));
        }
        /* if Dl == Dh, 68040 returns low word */
        tcg_gen_mov_i32(tcg_ctx, DREG(ext, 0), QREG_CC_N);
        tcg_gen_mov_i32(tcg_ctx, DREG(ext, 12), QREG_CC_Z);
        tcg_gen_or_i32(tcg_ctx, QREG_CC_Z, QREG_CC_Z, QREG_CC_N);

        tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_C, 0);

        set_cc_op(s, CC_OP_FLAGS);
        return;
    }
    SRC_EA(env, src1, OS_LONG, 0, NULL);
    if (m68k_feature(s->env, M68K_FEATURE_M68000)) {
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_C, 0);
        if (sign) {
            tcg_gen_muls2_i32(tcg_ctx, QREG_CC_N, QREG_CC_V, src1, DREG(ext, 12));
            /* QREG_CC_V is -(QREG_CC_V != (QREG_CC_N >> 31)) */
            tcg_gen_sari_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N, 31);
            tcg_gen_setcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_V, QREG_CC_V, QREG_CC_Z);
        } else {
            tcg_gen_mulu2_i32(tcg_ctx, QREG_CC_N, QREG_CC_V, src1, DREG(ext, 12));
            /* QREG_CC_V is -(QREG_CC_V != 0), use QREG_CC_C as 0 */
            tcg_gen_setcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_V, QREG_CC_V, QREG_CC_C);
        }
        tcg_gen_neg_i32(tcg_ctx, QREG_CC_V, QREG_CC_V);
        tcg_gen_mov_i32(tcg_ctx, DREG(ext, 12), QREG_CC_N);

        tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);

        set_cc_op(s, CC_OP_FLAGS);
    } else {
        /*
         * The upper 32 bits of the product are discarded, so
         * muls.l and mulu.l are functionally equivalent.
         */
        tcg_gen_mul_i32(tcg_ctx, DREG(ext, 12), src1, DREG(ext, 12));
        gen_logic_cc(s, DREG(ext, 12), OS_LONG);
    }
}